

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O0

vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> * __thiscall
HBF::expand(vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *__return_storage_ptr__,HBF *this,
           maze_s state)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 local_90 [8];
  maze_s state2;
  double y2;
  double x2;
  double theta2;
  double omega;
  double delta;
  double delta_i;
  int g2;
  double theta;
  double y;
  double x;
  int g;
  HBF *this_local;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *next_states;
  
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector(__return_storage_ptr__);
  for (delta = -35.0; delta < 40.0; delta = delta + 5.0) {
    dVar1 = this->SPEED;
    dVar2 = this->LENGTH;
    dVar3 = tan(delta * 0.017453292519943295);
    x2 = state.theta + (dVar1 / dVar2) * dVar3;
    if (0.0 < x2) {
      x2 = x2 + 6.283185307179586;
    }
    dVar1 = this->SPEED;
    dVar3 = cos(x2);
    dVar2 = this->SPEED;
    dVar4 = sin(x2);
    state2.x = dVar2 * dVar4 + state.y;
    local_90 = (undefined1  [8])(double)((int)state.g + 1);
    state2.y = x2;
    state2.g = dVar1 * dVar3 + state.x;
    state2.theta = state2.x;
    std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::push_back
              (__return_storage_ptr__,(value_type *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<HBF::maze_s> HBF::expand(HBF::maze_s state) {
    int g = state.g;
    double x = state.x;
    double y = state.y;
    double theta = state.theta;

    int g2 = g + 1;
    vector<HBF::maze_s> next_states;
    for (double delta_i = -35; delta_i < 40; delta_i += 5) {

        double delta = M_PI / 180.0 * delta_i;
        double omega = SPEED / LENGTH * tan(delta);
        double theta2 = theta + omega;
        if (theta2 > 0) {
            theta2 += 2 * M_PI;
        }
        double x2 = x + SPEED * cos(theta2);
        double y2 = y + SPEED * sin(theta2);
        HBF::maze_s state2;
        state2.g = g2;
        state2.x = x2;
        state2.y = y2;
        state2.theta = theta2;
        next_states.push_back(state2);

    }
    return next_states;
}